

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record.cpp
# Opt level: O1

void __thiscall ki::dml::Record::add_field(Record *this,FieldBase *field)

{
  pointer *pppFVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  iterator __position;
  FieldBase *local_68;
  string local_60;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*>
  local_40;
  
  __position._M_current =
       (this->m_fields).
       super__Vector_base<ki::dml::FieldBase_*,_std::allocator<ki::dml::FieldBase_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_68 = field;
  if (__position._M_current ==
      (this->m_fields).
      super__Vector_base<ki::dml::FieldBase_*,_std::allocator<ki::dml::FieldBase_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<ki::dml::FieldBase*,std::allocator<ki::dml::FieldBase*>>::
    _M_realloc_insert<ki::dml::FieldBase*const&>
              ((vector<ki::dml::FieldBase*,std::allocator<ki::dml::FieldBase*>> *)&this->m_fields,
               __position,&local_68);
  }
  else {
    *__position._M_current = field;
    pppFVar1 = &(this->m_fields).
                super__Vector_base<ki::dml::FieldBase_*,_std::allocator<ki::dml::FieldBase_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppFVar1 = *pppFVar1 + 1;
  }
  FieldBase::get_name_abi_cxx11_(&local_60,local_68);
  paVar2 = &local_40.first.field_2;
  paVar3 = &local_60.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p == paVar3) {
    local_40.first.field_2._8_8_ = local_60.field_2._8_8_;
    local_40.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_40.first._M_dataplus._M_p = local_60._M_dataplus._M_p;
  }
  local_40.first._M_string_length = local_60._M_string_length;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_40.second = local_68;
  local_60._M_dataplus._M_p = (pointer)paVar3;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ki::dml::FieldBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ki::dml::FieldBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ki::dml::FieldBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ki::dml::FieldBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ki::dml::FieldBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ki::dml::FieldBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ki::dml::FieldBase*>>>
              *)&this->m_field_map,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_40.first._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar3) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Record::add_field(FieldBase* field)
	{
		m_fields.push_back(field);
		m_field_map.insert({ field->get_name(), field });
	}